

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

void __thiscall hacd::vector<HACD::Vec3>::recreate(vector<HACD::Vec3> *this,HaU32 capacity)

{
  Vec3 *pVVar1;
  undefined8 *puVar2;
  uint uVar3;
  Vec3 *pVVar4;
  undefined8 uVar5;
  Vec3 *pVVar6;
  long lVar7;
  
  pVVar6 = allocate(this,capacity);
  pVVar4 = this->mData;
  if ((capacity != 0) && ((pVVar6 == (Vec3 *)0x0 || (pVVar6 == pVVar4)))) {
    __assert_fail("!capacity || newData && newData != mData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                  ,0x23b,"void hacd::vector<HACD::Vec3>::recreate(HaU32) [T = HACD::Vec3]");
  }
  uVar3 = this->mSize;
  for (lVar7 = 0; pVVar1 = (Vec3 *)((long)&pVVar6->x + lVar7), pVVar1 < pVVar6 + uVar3;
      lVar7 = lVar7 + 0xc) {
    puVar2 = (undefined8 *)((long)&pVVar4->x + lVar7);
    pVVar1->z = *(HaF32 *)(puVar2 + 1);
    uVar5 = *puVar2;
    pVVar1->x = (HaF32)(int)uVar5;
    pVVar1->y = (HaF32)(int)((ulong)uVar5 >> 0x20);
  }
  if (-1 < (int)this->mCapacity) {
    free(this->mData);
  }
  this->mData = pVVar6;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}